

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandFold(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  uint fCompl;
  char *pcVar4;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fCompl = 0;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"cvh"), iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) break;
    if (iVar1 != 99) {
      Abc_Print(-2,"usage: fold [-cvh]\n");
      Abc_Print(-2,"\t         folds constraints represented as separate outputs\n");
      Abc_Print(-2,"\t         (constraints fail when any of them becomes 1 in any timeframe)\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (fCompl == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle complementing constraints while folding [default = %s]\n",
                pcVar3);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar1 = -2;
LAB_00272ba1:
      Abc_Print(iVar1,pcVar3);
      return 1;
    }
    fCompl = fCompl ^ 1;
  }
  if (pAVar2 != (Abc_Ntk_t *)0x0) {
    if (pAVar2->ntkType == ABC_NTK_STRASH) {
      if (pAVar2->nConstrs == 0) {
        pcVar3 = "The network has no constraints.\n";
      }
      else {
        if (pAVar2->nConstrs != pAVar2->vPos->nSize) {
          if (pAVar2->nObjCounts[8] == 0) {
            Abc_Print(0,"The network is combinational.\n");
          }
          pAVar2 = Abc_NtkDarFold(pAVar2,fCompl,fVerbose);
          if (pAVar2 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
            return 0;
          }
          pcVar3 = "Transformation has failed.\n";
          iVar1 = 1;
          goto LAB_00272bca;
        }
        pcVar3 = "The network has no primary outputs (only constraints).\n";
      }
      iVar1 = 0;
    }
    else {
      pcVar3 = "Currently only works for structurally hashed circuits.\n";
      iVar1 = -1;
    }
LAB_00272bca:
    Abc_Print(iVar1,pcVar3);
    return 0;
  }
  pcVar3 = "Empty network.\n";
  iVar1 = -1;
  goto LAB_00272ba1;
}

Assistant:

int Abc_CommandFold( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fCompl;
    int fVerbose;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarFold( Abc_Ntk_t * pNtk, int fCompl, int fVerbose );
    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fCompl    =   0;
    fVerbose  =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fCompl ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) == 0 )
    {
        Abc_Print( 0, "The network has no constraints.\n" );
        return 0;
    }
    if ( Abc_NtkConstrNum(pNtk) == Abc_NtkPoNum(pNtk) )
    {
        Abc_Print( 0, "The network has no primary outputs (only constraints).\n" );
        return 0;
    }
    if ( Abc_NtkIsComb(pNtk) )
        Abc_Print( 0, "The network is combinational.\n" );
    // modify the current network
    pNtkRes = Abc_NtkDarFold( pNtk, fCompl, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( 1,"Transformation has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;
usage:
    Abc_Print( -2, "usage: fold [-cvh]\n" );
    Abc_Print( -2, "\t         folds constraints represented as separate outputs\n" );
    Abc_Print( -2, "\t         (constraints fail when any of them becomes 1 in any timeframe)\n" );
    Abc_Print( -2, "\t-c     : toggle complementing constraints while folding [default = %s]\n", fCompl? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}